

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O0

int __thiscall
ncnn::GridSample::forward
          (GridSample *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float v_4;
  int z0_1;
  int y0_4;
  int x0_4;
  float sample_z_1;
  float sample_y_4;
  float sample_x_4;
  int x_4;
  int y_4;
  float *gridptr_4;
  int z_1;
  float *outptr_4;
  Mat image_4;
  int q_4;
  float v1_2;
  float v0_2;
  float v11_2;
  float v10_2;
  float v01_2;
  float v00_2;
  float gamma;
  float beta_1;
  float alpha_1;
  float v111;
  float v110;
  float v101;
  float v100;
  float v011;
  float v010;
  float v001;
  float v000;
  int z1;
  int y1_2;
  int x1_2;
  int z0;
  int y0_3;
  int x0_3;
  float v_3;
  float sample_z;
  float sample_y_3;
  float sample_x_3;
  int x_3;
  int y_3;
  float *gridptr_3;
  int z;
  float *outptr_3;
  Mat image_3;
  int q_3;
  int outd;
  int outh_1;
  int outw_1;
  float v3;
  float v2;
  float v1_1;
  float v0_1;
  float y_coeffs [4];
  float x_coeffs [4];
  float v33;
  float v32;
  float v31;
  float v30;
  float v23;
  float v22;
  float v21;
  float v20;
  float v13;
  float v12;
  float v11_1;
  float v10_1;
  float v03;
  float v02;
  float v01_1;
  float v00_1;
  int y3;
  int x3;
  int y2;
  int x2;
  int y0_2;
  int x0_2;
  int y1_1;
  int x1_1;
  float v_2;
  float sample_y_2;
  float sample_x_2;
  int x_2;
  float *gridptr_2;
  int y_2;
  float *outptr_2;
  Mat image_2;
  int q_2;
  float v_1;
  int y0_1;
  int x0_1;
  float sample_y_1;
  float sample_x_1;
  int x_1;
  float *gridptr_1;
  int y_1;
  float *outptr_1;
  Mat image_1;
  int q_1;
  float v1;
  float v0;
  float beta;
  float alpha;
  float v11;
  float v10;
  float v01;
  float v00;
  int y1;
  int x1;
  int y0;
  int x0;
  float v;
  float sample_y;
  float sample_x;
  int x;
  float *gridptr;
  int y;
  float *outptr;
  Mat image;
  int q;
  int outh;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *top_blob;
  Mat *grid;
  Mat *bottom_blob;
  Mat *m_14;
  Mat *m_12;
  Mat *m_11;
  Mat *m_9;
  Mat *m_8;
  Mat *m_6;
  Mat *m_5;
  Mat *m_3;
  Mat *m_2;
  Mat *m;
  Mat *m_13;
  Mat *m_10;
  Mat *m_7;
  Mat *m_4;
  Mat *m_1;
  undefined8 in_stack_ffffffffffffea08;
  undefined8 uVar6;
  int in_stack_ffffffffffffea10;
  int in_stack_ffffffffffffea14;
  void **in_stack_ffffffffffffea18;
  int in_stack_ffffffffffffea20;
  float in_stack_ffffffffffffea24;
  int in_stack_ffffffffffffea28;
  int in_stack_ffffffffffffea2c;
  undefined4 in_stack_ffffffffffffea30;
  int in_stack_ffffffffffffea34;
  int in_stack_ffffffffffffea38;
  int in_stack_ffffffffffffea3c;
  Mat *in_stack_ffffffffffffea40;
  Allocator *in_stack_ffffffffffffea90;
  int local_1278;
  int local_1274;
  undefined8 local_1270;
  undefined8 local_1268;
  undefined8 local_1260;
  undefined4 local_1258;
  Allocator *local_1250;
  undefined4 local_1248;
  undefined4 local_1244;
  undefined4 local_1240;
  undefined4 local_123c;
  undefined4 local_1238;
  undefined8 local_1230;
  float *local_1228;
  int local_121c;
  undefined8 local_1218;
  undefined8 local_1210;
  undefined8 local_1208;
  undefined4 local_1200;
  Allocator *local_11f8;
  undefined4 local_11f0;
  undefined4 local_11ec;
  undefined4 local_11e8;
  undefined4 local_11e4;
  undefined4 local_11e0;
  undefined8 local_11d8;
  float *local_11d0;
  void *local_11c8;
  int *local_11c0;
  ulong local_11b8;
  int local_11b0;
  Allocator *local_11a8;
  int local_11a0;
  int local_119c;
  int local_1198;
  undefined4 local_1194;
  int local_1190;
  ulong local_1188;
  int local_1180;
  float local_117c;
  float local_1178;
  float local_1174;
  float local_1170;
  float local_116c;
  float local_1168;
  float local_1164;
  float local_1160;
  float local_115c;
  float local_1158;
  float local_1154;
  float local_1150;
  float local_114c;
  float local_1148;
  float local_1144;
  float local_1140;
  float local_113c;
  int local_1138;
  int local_1134;
  int local_1130;
  int local_112c;
  int local_1128;
  int local_1124;
  float local_1120;
  float local_111c;
  float local_1118;
  float local_1114;
  int local_1110;
  int local_110c;
  undefined8 local_1108;
  undefined8 local_1100;
  undefined8 local_10f8;
  undefined4 local_10f0;
  Allocator *local_10e8;
  undefined4 local_10e0;
  undefined4 local_10dc;
  undefined4 local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  undefined8 local_10c8;
  float *local_10c0;
  int local_10b4;
  undefined8 local_10b0;
  undefined8 local_10a8;
  undefined8 local_10a0;
  undefined4 local_1098;
  Allocator *local_1090;
  undefined4 local_1088;
  undefined4 local_1084;
  undefined4 local_1080;
  undefined4 local_107c;
  undefined4 local_1078;
  undefined8 local_1070;
  float *local_1068;
  void *local_1060;
  int *local_1058;
  ulong local_1050;
  int local_1048;
  Allocator *local_1040;
  int local_1038;
  int local_1034;
  int local_1030;
  undefined4 local_102c;
  int local_1028;
  ulong local_1020;
  int local_1018;
  int local_1014;
  int local_1010;
  int local_100c;
  float local_1008;
  float local_1004;
  float local_1000;
  float local_ffc;
  float local_ff8;
  float local_ff4;
  float local_ff0;
  float local_fec;
  float local_fe8;
  float local_fe4;
  float local_fe0;
  float local_fdc;
  float local_fd0;
  float local_fcc;
  float local_fc8;
  float local_fc4;
  float local_fc0;
  float local_fbc;
  float local_fb8;
  float local_fb4;
  float local_fb0;
  float local_fac;
  float local_fa8;
  float local_fa4;
  float local_fa0;
  float local_f9c;
  float local_f98;
  float local_f94;
  int local_f90;
  int local_f8c;
  int local_f88;
  int local_f84;
  int local_f80;
  int local_f7c;
  int local_f78;
  int local_f74;
  float local_f70;
  float local_f6c;
  float local_f68;
  int local_f64;
  undefined8 local_f60;
  undefined8 local_f58;
  undefined8 local_f50;
  undefined4 local_f48;
  Allocator *local_f40;
  undefined4 local_f38;
  undefined4 local_f34;
  undefined4 local_f30;
  undefined4 local_f2c;
  undefined4 local_f28;
  undefined8 local_f20;
  float *local_f18;
  int local_f0c;
  undefined8 local_f08;
  undefined8 local_f00;
  undefined8 local_ef8;
  undefined4 local_ef0;
  Allocator *local_ee8;
  undefined4 local_ee0;
  undefined4 local_edc;
  undefined4 local_ed8;
  undefined4 local_ed4;
  undefined4 local_ed0;
  undefined8 local_ec8;
  float *local_ec0;
  void *local_eb8;
  int *local_eb0;
  ulong local_ea8;
  int local_ea0;
  Allocator *local_e98;
  int local_e90;
  int local_e8c;
  int local_e88;
  undefined4 local_e84;
  int local_e80;
  ulong local_e78;
  int local_e6c;
  float local_e68;
  int local_e64;
  int local_e60;
  float local_e5c;
  float local_e58;
  int local_e54;
  undefined8 local_e50;
  undefined8 local_e48;
  undefined8 local_e40;
  undefined4 local_e38;
  Allocator *local_e30;
  undefined4 local_e28;
  undefined4 local_e24;
  undefined4 local_e20;
  undefined4 local_e1c;
  undefined4 local_e18;
  undefined8 local_e10;
  float *local_e08;
  int local_dfc;
  undefined8 local_df8;
  undefined8 local_df0;
  undefined8 local_de8;
  undefined4 local_de0;
  Allocator *local_dd8;
  undefined4 local_dd0;
  undefined4 local_dcc;
  undefined4 local_dc8;
  undefined4 local_dc4;
  undefined4 local_dc0;
  undefined8 local_db8;
  float *local_db0;
  void *local_da8;
  int *local_da0;
  ulong local_d98;
  int local_d90;
  Allocator *local_d88;
  int local_d80;
  int local_d7c;
  int local_d78;
  undefined4 local_d74;
  int local_d70;
  ulong local_d68;
  int local_d5c;
  float local_d58;
  float local_d54;
  float local_d50;
  float local_d4c;
  float local_d48;
  float local_d44;
  float local_d40;
  float local_d3c;
  int local_d38;
  int local_d34;
  int local_d30;
  int local_d2c;
  float local_d28;
  float local_d24;
  float local_d20;
  int local_d1c;
  undefined8 local_d18;
  undefined8 local_d10;
  undefined8 local_d08;
  undefined4 local_d00;
  Allocator *local_cf8;
  undefined4 local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined4 local_ce0;
  undefined8 local_cd8;
  float *local_cd0;
  int local_cc8;
  undefined8 local_cb8;
  undefined8 local_cb0;
  undefined8 local_ca8;
  undefined4 local_ca0;
  Allocator *local_c98;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined4 local_c88;
  undefined4 local_c84;
  undefined4 local_c80;
  undefined8 local_c78;
  float *local_c70;
  void *local_c68;
  int *local_c60;
  ulong local_c58;
  int local_c50;
  Allocator *local_c48;
  int local_c40;
  int local_c3c;
  int local_c38;
  undefined4 local_c34;
  int local_c30;
  ulong local_c28;
  int local_c1c;
  int local_c18;
  int local_c14;
  size_t local_c10;
  int local_c04;
  int local_c00;
  int local_bfc;
  int local_bf8;
  int local_bf4;
  reference local_bf0;
  const_reference local_be8;
  const_reference local_be0;
  long local_bd8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_bd0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_bc8;
  reference local_bb0;
  reference local_ba8;
  undefined1 local_b9d;
  int local_b9c;
  const_reference local_b98;
  undefined8 *local_b90;
  undefined1 local_b85;
  int local_b84;
  const_reference local_b80;
  void **local_b78;
  undefined1 local_b6d;
  int local_b6c;
  const_reference local_b68;
  undefined8 *local_b60;
  undefined1 local_b55;
  int local_b54;
  const_reference local_b50;
  void **local_b48;
  undefined1 local_b3d;
  int local_b3c;
  const_reference local_b38;
  undefined8 *local_b30;
  undefined1 local_b25;
  int local_b24;
  const_reference local_b20;
  void **local_b18;
  undefined1 local_b0d;
  int local_b0c;
  const_reference local_b08;
  undefined8 *local_b00;
  undefined1 local_af5;
  int local_af4;
  const_reference local_af0;
  void **local_ae8;
  undefined1 local_add;
  int local_adc;
  const_reference local_ad8;
  undefined8 *local_ad0;
  undefined1 local_ac5;
  int local_ac4;
  const_reference local_ac0;
  void **local_ab8;
  undefined1 local_aad;
  int local_aac;
  reference local_aa8;
  undefined8 *local_aa0;
  undefined1 local_a95;
  int local_a94;
  reference local_a90;
  undefined8 *local_a88;
  undefined1 local_a7d;
  int local_a7c;
  reference local_a78;
  undefined8 *local_a70;
  undefined1 local_a65;
  int local_a64;
  reference local_a60;
  undefined8 *local_a58;
  undefined1 local_a4d;
  int local_a4c;
  reference local_a48;
  undefined8 *local_a40;
  undefined8 *local_a38;
  undefined8 *local_a30;
  undefined8 *local_a28;
  undefined8 *local_a20;
  undefined8 *local_a18;
  undefined8 *local_998;
  undefined8 *local_988;
  void **local_978;
  undefined8 *local_968;
  undefined8 *local_958;
  void **local_948;
  undefined8 *local_938;
  undefined8 *local_928;
  void **local_918;
  undefined8 *local_908;
  undefined8 *local_8f8;
  void **local_8e8;
  undefined8 *local_8d8;
  undefined8 *local_8c8;
  void **local_8b8;
  undefined8 *local_8a8;
  undefined8 *local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 *local_888;
  reference local_880;
  reference local_878;
  Allocator *local_870;
  int local_864;
  size_t local_860;
  float *local_858;
  int local_84c;
  int local_848;
  int local_844;
  undefined8 *local_840;
  Allocator *local_838;
  int local_82c;
  size_t local_828;
  float *local_820;
  int local_814;
  int local_810;
  int local_80c;
  undefined8 *local_808;
  Allocator *local_800;
  int local_7f4;
  size_t local_7f0;
  float *local_7e8;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  undefined8 *local_7d0;
  Allocator *local_7c8;
  int local_7bc;
  size_t local_7b8;
  float *local_7b0;
  int local_7a4;
  int local_7a0;
  int local_79c;
  undefined8 *local_798;
  Allocator *local_790;
  int local_784;
  size_t local_780;
  float *local_778;
  int local_76c;
  int local_768;
  int local_764;
  undefined8 *local_760;
  Allocator *local_758;
  int local_74c;
  ulong local_748;
  void *local_740;
  int local_734;
  int local_730;
  int local_72c;
  void **local_728;
  Allocator *local_720;
  int local_714;
  size_t local_710;
  float *local_708;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  undefined8 *local_6f0;
  Allocator *local_6e8;
  int local_6dc;
  ulong local_6d8;
  void *local_6d0;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  void **local_6b8;
  Allocator *local_6b0;
  int local_6a4;
  size_t local_6a0;
  float *local_698;
  int local_68c;
  int local_688;
  int local_684;
  undefined8 *local_680;
  Allocator *local_678;
  int local_66c;
  ulong local_668;
  void *local_660;
  int local_654;
  int local_650;
  int local_64c;
  void **local_648;
  Allocator *local_640;
  int local_634;
  size_t local_630;
  float *local_628;
  int local_61c;
  int local_618;
  int local_614;
  undefined8 *local_610;
  Allocator *local_608;
  int local_5fc;
  ulong local_5f8;
  void *local_5f0;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  void **local_5d8;
  Allocator *local_5d0;
  int local_5c4;
  size_t local_5c0;
  float *local_5b8;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  undefined8 *local_5a0;
  Allocator *local_598;
  int local_58c;
  ulong local_588;
  void *local_580;
  int local_574;
  int local_570;
  int local_56c;
  void **local_568;
  Allocator *local_560;
  int local_554;
  size_t local_550;
  float *local_548;
  int local_53c;
  int local_538;
  int local_534;
  undefined8 *local_530;
  undefined4 local_524;
  long local_520;
  undefined4 local_514;
  long local_510;
  undefined4 local_504;
  long local_500;
  undefined4 local_4f4;
  long local_4f0;
  undefined4 local_4e4;
  long local_4e0;
  undefined4 local_4d4;
  long local_4d0;
  undefined4 local_4c4;
  long local_4c0;
  undefined4 local_4b4;
  long local_4b0;
  undefined4 local_4a4;
  long local_4a0;
  undefined4 local_494;
  long local_490;
  undefined4 local_484;
  long local_480;
  undefined4 local_474;
  long local_470;
  undefined4 local_464;
  long local_460;
  undefined4 local_454;
  long local_450;
  undefined4 local_444;
  long local_440;
  int local_428;
  undefined4 local_424;
  void **local_420;
  undefined8 *local_400;
  undefined8 *local_3e0;
  int local_3c8;
  undefined4 local_3c4;
  void **local_3c0;
  undefined8 *local_3a0;
  undefined8 *local_380;
  int local_368;
  undefined4 local_364;
  void **local_360;
  undefined8 *local_340;
  undefined8 *local_320;
  int local_308;
  undefined4 local_304;
  void **local_300;
  undefined8 *local_2e0;
  undefined8 *local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  undefined8 *local_280;
  undefined8 *local_260;
  void *local_d0;
  void *local_a0;
  void *local_70;
  void *local_40;
  void *local_10;
  
  local_bd8 = in_RCX;
  local_bd0 = in_RDX;
  local_bc8 = in_RSI;
  local_be0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_be8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_bc8,1);
  local_bf0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_bd0,0);
  local_bf4 = local_be0->w;
  local_bf8 = local_be0->h;
  local_bfc = local_be0->d;
  local_c00 = local_be0->c;
  local_c04 = local_be0->dims;
  local_c10 = local_be0->elemsize;
  if (local_c04 == 3) {
    local_c14 = local_be8->h;
    local_c18 = local_be8->c;
    Mat::create(in_stack_ffffffffffffea40,in_stack_ffffffffffffea3c,in_stack_ffffffffffffea38,
                in_stack_ffffffffffffea34,
                CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                (Allocator *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
    local_ba8 = local_bf0;
    bVar1 = true;
    if (local_bf0->data != (void *)0x0) {
      local_880 = local_bf0;
      bVar1 = local_bf0->cstep * (long)local_bf0->c == 0;
    }
    if (bVar1) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd0) == 1) {
      for (local_c1c = 0; local_c1c < local_c00; local_c1c = local_c1c + 1) {
        local_ab8 = &local_c68;
        local_72c = local_be0->w;
        local_730 = local_be0->h;
        local_734 = local_be0->d;
        local_740 = (void *)((long)local_be0->data +
                            local_be0->cstep * (long)local_c1c * local_be0->elemsize);
        local_748 = local_be0->elemsize;
        local_74c = local_be0->elempack;
        local_758 = local_be0->allocator;
        local_728 = &local_c68;
        local_490 = (long)local_72c * (long)local_730 * local_748;
        local_c28 = (local_490 + 0xfU & 0xfffffffffffffff0) / local_748;
        local_c40 = local_be0->dims + -1;
        if (local_be0->dims == 4) {
          local_c28 = (long)local_be0->w * (long)local_be0->h;
        }
        local_a40 = &local_cb8;
        local_844 = local_bf0->w;
        local_848 = local_bf0->h;
        local_84c = local_bf0->d;
        local_c70 = (float *)((long)local_bf0->data +
                             local_bf0->cstep * (long)local_c1c * local_bf0->elemsize);
        local_860 = local_bf0->elemsize;
        local_864 = local_bf0->elempack;
        local_870 = local_bf0->allocator;
        local_840 = &local_cb8;
        local_440 = (long)local_844 * (long)local_848 * local_860;
        local_a18 = &local_cb8;
        local_998 = &local_cb8;
        local_c34 = 1;
        local_c60 = (int *)0x0;
        local_444 = 0x10;
        local_494 = 0x10;
        local_a48 = local_bf0;
        local_a4c = local_c1c;
        local_a4d = 1;
        local_ac0 = local_be0;
        local_ac4 = local_c1c;
        local_ac5 = 1;
        local_cb8 = 0;
        local_ca8 = 0;
        local_ca0 = 0;
        local_c90 = 0;
        local_c8c = 0;
        local_c88 = 0;
        local_c84 = 0;
        local_c80 = 0;
        local_c78 = 0;
        local_cb0 = 0;
        local_858 = local_c70;
        local_260 = local_998;
        local_c98 = local_870;
        local_c68 = local_740;
        local_c58 = local_748;
        local_c50 = local_74c;
        local_c48 = local_758;
        local_c3c = local_72c;
        local_c38 = local_730;
        local_c30 = local_734;
        for (local_cc8 = 0; local_cc8 < local_c18; local_cc8 = local_cc8 + 1) {
          local_ad0 = &local_d18;
          local_6f4 = local_be8->w;
          local_6f8 = local_be8->h;
          local_6fc = local_be8->d;
          local_cd0 = (float *)((long)local_be8->data +
                               local_be8->cstep * (long)local_cc8 * local_be8->elemsize);
          local_710 = local_be8->elemsize;
          local_714 = local_be8->elempack;
          local_720 = local_be8->allocator;
          local_6f0 = &local_d18;
          local_4a0 = (long)local_6f4 * (long)local_6f8 * local_710;
          local_888 = &local_d18;
          local_988 = &local_d18;
          local_4a4 = 0x10;
          local_ad8 = local_be8;
          local_adc = local_cc8;
          local_add = 1;
          local_d18 = 0;
          local_d08 = 0;
          local_d00 = 0;
          local_cf0 = 0;
          local_cec = 0;
          local_ce8 = 0;
          local_ce4 = 0;
          local_ce0 = 0;
          local_cd8 = 0;
          local_d10 = 0;
          local_708 = local_cd0;
          local_280 = local_988;
          local_cf8 = local_720;
          for (local_d1c = 0; local_d1c < local_c14; local_d1c = local_d1c + 1) {
            local_d20 = *local_cd0;
            local_d24 = local_cd0[1];
            local_d20 = grid_sample_unormalize(local_bf4,local_d20,*(int *)(in_RDI + 0xd8));
            local_d24 = grid_sample_unormalize(local_bf8,local_d24,*(int *)(in_RDI + 0xd8));
            dVar5 = std::floor((double)(ulong)(uint)local_d20);
            local_d2c = (int)SUB84(dVar5,0);
            dVar5 = std::floor((double)(ulong)(uint)local_d24);
            local_d30 = (int)SUB84(dVar5,0);
            local_d34 = local_d2c + 1;
            local_d38 = local_d30 + 1;
            local_d3c = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c5dca3);
            local_d40 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c5dcf0);
            local_d44 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c5dd3d);
            local_d48 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c5dd8a);
            local_d4c = local_d20 - (float)local_d2c;
            local_d50 = local_d24 - (float)local_d30;
            local_d54 = local_d3c * (1.0 - local_d4c) + local_d40 * local_d4c;
            local_d58 = local_d44 * (1.0 - local_d4c) + local_d48 * local_d4c;
            local_d28 = local_d54 * (1.0 - local_d50) + local_d58 * local_d50;
            *local_c70 = local_d28;
            local_c70 = local_c70 + 1;
            local_cd0 = local_cd0 + 2;
          }
        }
        local_978 = &local_c68;
        local_2a0 = local_978;
        if (local_c60 != (int *)0x0) {
          local_2a4 = 0xffffffff;
          LOCK();
          local_2a8 = *local_c60;
          *local_c60 = *local_c60 + -1;
          UNLOCK();
          if (local_2a8 == 1) {
            if (local_c48 == (Allocator *)0x0) {
              local_d0 = local_c68;
              if (local_c68 != (void *)0x0) {
                free(local_c68);
              }
            }
            else {
              (*local_c48->_vptr_Allocator[3])(local_c48,local_c68);
            }
          }
        }
        local_c68 = (void *)0x0;
        local_c58 = 0;
        local_c50 = 0;
        local_c40 = 0;
        local_c3c = 0;
        local_c38 = 0;
        local_c34 = 0;
        local_c30 = 0;
        local_c28 = 0;
        local_c60 = (int *)0x0;
      }
    }
    else if (*(int *)(in_RDI + 0xd0) == 2) {
      for (local_d5c = 0; local_d5c < local_c00; local_d5c = local_d5c + 1) {
        local_ae8 = &local_da8;
        local_6bc = local_be0->w;
        local_6c0 = local_be0->h;
        local_6c4 = local_be0->d;
        local_6d0 = (void *)((long)local_be0->data +
                            local_be0->cstep * (long)local_d5c * local_be0->elemsize);
        local_6d8 = local_be0->elemsize;
        local_6dc = local_be0->elempack;
        local_6e8 = local_be0->allocator;
        local_6b8 = &local_da8;
        local_4b0 = (long)local_6bc * (long)local_6c0 * local_6d8;
        local_d68 = (local_4b0 + 0xfU & 0xfffffffffffffff0) / local_6d8;
        local_d80 = local_be0->dims + -1;
        if (local_be0->dims == 4) {
          local_d68 = (long)local_be0->w * (long)local_be0->h;
        }
        local_a58 = &local_df8;
        local_80c = local_bf0->w;
        local_810 = local_bf0->h;
        local_814 = local_bf0->d;
        local_db0 = (float *)((long)local_bf0->data +
                             local_bf0->cstep * (long)local_d5c * local_bf0->elemsize);
        local_828 = local_bf0->elemsize;
        local_82c = local_bf0->elempack;
        local_838 = local_bf0->allocator;
        local_808 = &local_df8;
        local_450 = (long)local_80c * (long)local_810 * local_828;
        local_a20 = &local_df8;
        local_968 = &local_df8;
        local_d74 = 1;
        local_da0 = (int *)0x0;
        local_454 = 0x10;
        local_4b4 = 0x10;
        local_a60 = local_bf0;
        local_a64 = local_d5c;
        local_a65 = 1;
        local_af0 = local_be0;
        local_af4 = local_d5c;
        local_af5 = 1;
        local_df8 = 0;
        local_de8 = 0;
        local_de0 = 0;
        local_dd0 = 0;
        local_dcc = 0;
        local_dc8 = 0;
        local_dc4 = 0;
        local_dc0 = 0;
        local_db8 = 0;
        local_df0 = 0;
        local_820 = local_db0;
        local_2c0 = local_968;
        local_dd8 = local_838;
        local_da8 = local_6d0;
        local_d98 = local_6d8;
        local_d90 = local_6dc;
        local_d88 = local_6e8;
        local_d7c = local_6bc;
        local_d78 = local_6c0;
        local_d70 = local_6c4;
        for (local_dfc = 0; local_dfc < local_c18; local_dfc = local_dfc + 1) {
          local_b00 = &local_e50;
          local_684 = local_be8->w;
          local_688 = local_be8->h;
          local_68c = local_be8->d;
          local_e08 = (float *)((long)local_be8->data +
                               local_be8->cstep * (long)local_dfc * local_be8->elemsize);
          local_6a0 = local_be8->elemsize;
          local_6a4 = local_be8->elempack;
          local_6b0 = local_be8->allocator;
          local_680 = &local_e50;
          local_4c0 = (long)local_684 * (long)local_688 * local_6a0;
          local_890 = &local_e50;
          local_958 = &local_e50;
          local_4c4 = 0x10;
          local_b08 = local_be8;
          local_b0c = local_dfc;
          local_b0d = 1;
          local_e50 = 0;
          local_e40 = 0;
          local_e38 = 0;
          local_e28 = 0;
          local_e24 = 0;
          local_e20 = 0;
          local_e1c = 0;
          local_e18 = 0;
          local_e10 = 0;
          local_e48 = 0;
          local_698 = local_e08;
          local_2e0 = local_958;
          local_e30 = local_6b0;
          for (local_e54 = 0; local_e54 < local_c14; local_e54 = local_e54 + 1) {
            local_e58 = *local_e08;
            local_e5c = local_e08[1];
            local_e58 = grid_sample_unormalize(local_bf4,local_e58,*(int *)(in_RDI + 0xd8));
            local_e5c = grid_sample_unormalize(local_bf8,local_e5c,*(int *)(in_RDI + 0xd8));
            dVar5 = std::round((double)(ulong)(uint)local_e58);
            local_e60 = (int)SUB84(dVar5,0);
            dVar5 = std::round((double)(ulong)(uint)local_e5c);
            local_e64 = (int)SUB84(dVar5,0);
            local_e68 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c5eed4);
            *local_db0 = local_e68;
            local_db0 = local_db0 + 1;
            local_e08 = local_e08 + 2;
          }
        }
        local_948 = &local_da8;
        local_300 = local_948;
        if (local_da0 != (int *)0x0) {
          local_304 = 0xffffffff;
          LOCK();
          local_308 = *local_da0;
          *local_da0 = *local_da0 + -1;
          UNLOCK();
          if (local_308 == 1) {
            if (local_d88 == (Allocator *)0x0) {
              local_a0 = local_da8;
              if (local_da8 != (void *)0x0) {
                free(local_da8);
              }
            }
            else {
              (*local_d88->_vptr_Allocator[3])(local_d88,local_da8);
            }
          }
        }
        local_da8 = (void *)0x0;
        local_d98 = 0;
        local_d90 = 0;
        local_d80 = 0;
        local_d7c = 0;
        local_d78 = 0;
        local_d74 = 0;
        local_d70 = 0;
        local_d68 = 0;
        local_da0 = (int *)0x0;
      }
    }
    else if (*(int *)(in_RDI + 0xd0) == 3) {
      for (local_e6c = 0; local_e6c < local_c00; local_e6c = local_e6c + 1) {
        local_b18 = &local_eb8;
        local_64c = local_be0->w;
        local_650 = local_be0->h;
        local_654 = local_be0->d;
        local_660 = (void *)((long)local_be0->data +
                            local_be0->cstep * (long)local_e6c * local_be0->elemsize);
        local_668 = local_be0->elemsize;
        local_66c = local_be0->elempack;
        local_678 = local_be0->allocator;
        local_648 = &local_eb8;
        local_4d0 = (long)local_64c * (long)local_650 * local_668;
        local_e78 = (local_4d0 + 0xfU & 0xfffffffffffffff0) / local_668;
        local_e90 = local_be0->dims + -1;
        if (local_be0->dims == 4) {
          local_e78 = (long)local_be0->w * (long)local_be0->h;
        }
        local_a70 = &local_f08;
        local_7d4 = local_bf0->w;
        local_7d8 = local_bf0->h;
        local_7dc = local_bf0->d;
        local_ec0 = (float *)((long)local_bf0->data +
                             local_bf0->cstep * (long)local_e6c * local_bf0->elemsize);
        local_7f0 = local_bf0->elemsize;
        local_7f4 = local_bf0->elempack;
        local_800 = local_bf0->allocator;
        local_7d0 = &local_f08;
        local_460 = (long)local_7d4 * (long)local_7d8 * local_7f0;
        local_a28 = &local_f08;
        local_938 = &local_f08;
        local_e84 = 1;
        local_eb0 = (int *)0x0;
        local_464 = 0x10;
        local_4d4 = 0x10;
        local_a78 = local_bf0;
        local_a7c = local_e6c;
        local_a7d = 1;
        local_b20 = local_be0;
        local_b24 = local_e6c;
        local_b25 = 1;
        local_f08 = 0;
        local_ef8 = 0;
        local_ef0 = 0;
        local_ee0 = 0;
        local_edc = 0;
        local_ed8 = 0;
        local_ed4 = 0;
        local_ed0 = 0;
        local_ec8 = 0;
        local_f00 = 0;
        local_7e8 = local_ec0;
        local_320 = local_938;
        local_ee8 = local_800;
        local_eb8 = local_660;
        local_ea8 = local_668;
        local_ea0 = local_66c;
        local_e98 = local_678;
        local_e8c = local_64c;
        local_e88 = local_650;
        local_e80 = local_654;
        for (local_f0c = 0; local_f0c < local_c18; local_f0c = local_f0c + 1) {
          local_b30 = &local_f60;
          local_614 = local_be8->w;
          local_618 = local_be8->h;
          local_61c = local_be8->d;
          local_f18 = (float *)((long)local_be8->data +
                               local_be8->cstep * (long)local_f0c * local_be8->elemsize);
          local_630 = local_be8->elemsize;
          local_634 = local_be8->elempack;
          local_640 = local_be8->allocator;
          local_610 = &local_f60;
          local_4e0 = (long)local_614 * (long)local_618 * local_630;
          local_898 = &local_f60;
          local_928 = &local_f60;
          local_4e4 = 0x10;
          local_b38 = local_be8;
          local_b3c = local_f0c;
          local_b3d = 1;
          local_f60 = 0;
          local_f50 = 0;
          local_f48 = 0;
          local_f38 = 0;
          local_f34 = 0;
          local_f30 = 0;
          local_f2c = 0;
          local_f28 = 0;
          local_f20 = 0;
          local_f58 = 0;
          local_628 = local_f18;
          local_340 = local_928;
          local_f40 = local_640;
          for (local_f64 = 0; local_f64 < local_c14; local_f64 = local_f64 + 1) {
            local_f68 = *local_f18;
            local_f6c = local_f18[1];
            local_f68 = grid_sample_unormalize(local_bf4,local_f68,*(int *)(in_RDI + 0xd8));
            local_f6c = grid_sample_unormalize(local_bf8,local_f6c,*(int *)(in_RDI + 0xd8));
            fVar3 = floorf(local_f68);
            local_f74 = (int)fVar3;
            fVar3 = floorf(local_f6c);
            local_f78 = (int)fVar3;
            local_f7c = local_f74 + -1;
            local_f80 = local_f78 + -1;
            local_f84 = local_f74 + 1;
            local_f88 = local_f78 + 1;
            local_f8c = local_f74 + 2;
            local_f90 = local_f78 + 2;
            local_f94 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c5ff63);
            local_f98 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c5ffb0);
            local_f9c = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c5fffd);
            local_fa0 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c6004a);
            local_fa4 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c60097);
            local_fa8 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c600e4);
            local_fac = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c60131);
            local_fb0 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c6017e);
            local_fb4 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c601cb);
            local_fb8 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c60218);
            local_fbc = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c60265);
            local_fc0 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c602b2);
            local_fc4 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c602ff);
            local_fc8 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c6034c);
            local_fcc = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c60399);
            local_fd0 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea14,
                                                          in_stack_ffffffffffffea10),
                                          (int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                                          (int)in_stack_ffffffffffffea08,0,0x1c603e6);
            interpolate_cubic(local_f68 - (float)local_f74,&local_fe8);
            interpolate_cubic(local_f6c - (float)local_f78,&local_ff8);
            local_ffc = local_f94 * local_fe8 + local_f98 * local_fe4 + local_f9c * local_fe0 +
                        local_fa0 * local_fdc;
            local_1000 = local_fa4 * local_fe8 + local_fa8 * local_fe4 + local_fac * local_fe0 +
                         local_fb0 * local_fdc;
            local_1004 = local_fb4 * local_fe8 + local_fb8 * local_fe4 + local_fbc * local_fe0 +
                         local_fc0 * local_fdc;
            local_1008 = local_fc4 * local_fe8 + local_fc8 * local_fe4 + local_fcc * local_fe0 +
                         local_fd0 * local_fdc;
            local_f70 = local_ffc * local_ff8 + local_1000 * local_ff4 + local_1004 * local_ff0 +
                        local_1008 * local_fec;
            *local_ec0 = local_f70;
            local_ec0 = local_ec0 + 1;
            local_f18 = local_f18 + 2;
          }
        }
        local_918 = &local_eb8;
        local_360 = local_918;
        if (local_eb0 != (int *)0x0) {
          local_364 = 0xffffffff;
          LOCK();
          local_368 = *local_eb0;
          *local_eb0 = *local_eb0 + -1;
          UNLOCK();
          if (local_368 == 1) {
            if (local_e98 == (Allocator *)0x0) {
              local_70 = local_eb8;
              if (local_eb8 != (void *)0x0) {
                free(local_eb8);
              }
            }
            else {
              (*local_e98->_vptr_Allocator[3])(local_e98,local_eb8);
            }
          }
        }
        local_eb8 = (void *)0x0;
        local_ea8 = 0;
        local_ea0 = 0;
        local_e90 = 0;
        local_e8c = 0;
        local_e88 = 0;
        local_e84 = 0;
        local_e80 = 0;
        local_e78 = 0;
        local_eb0 = (int *)0x0;
      }
    }
  }
  if (local_c04 == 4) {
    local_100c = local_be8->h;
    local_1010 = local_be8->d;
    local_1014 = local_be8->c;
    uVar6 = *(undefined8 *)(local_bd8 + 8);
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28,(int)in_stack_ffffffffffffea24,
                in_stack_ffffffffffffea20,(size_t)in_stack_ffffffffffffea18,
                in_stack_ffffffffffffea90);
    local_bb0 = local_bf0;
    bVar1 = true;
    if (local_bf0->data != (void *)0x0) {
      local_878 = local_bf0;
      bVar1 = local_bf0->cstep * (long)local_bf0->c == 0;
    }
    if (bVar1) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd0) == 1) {
      for (local_1018 = 0; local_1018 < local_c00; local_1018 = local_1018 + 1) {
        local_b48 = &local_1060;
        local_5dc = local_be0->w;
        local_5e0 = local_be0->h;
        local_5e4 = local_be0->d;
        local_5f0 = (void *)((long)local_be0->data +
                            local_be0->cstep * (long)local_1018 * local_be0->elemsize);
        local_5f8 = local_be0->elemsize;
        local_5fc = local_be0->elempack;
        local_608 = local_be0->allocator;
        local_5d8 = &local_1060;
        local_4f0 = (long)local_5dc * (long)local_5e0 * local_5f8;
        local_1020 = (local_4f0 + 0xfU & 0xfffffffffffffff0) / local_5f8;
        local_1038 = local_be0->dims + -1;
        if (local_be0->dims == 4) {
          local_1020 = (long)local_be0->w * (long)local_be0->h;
        }
        local_a88 = &local_10b0;
        local_79c = local_bf0->w;
        local_7a0 = local_bf0->h;
        local_7a4 = local_bf0->d;
        local_1068 = (float *)((long)local_bf0->data +
                              local_bf0->cstep * (long)local_1018 * local_bf0->elemsize);
        local_7b8 = local_bf0->elemsize;
        local_7bc = local_bf0->elempack;
        local_7c8 = local_bf0->allocator;
        local_798 = &local_10b0;
        local_470 = (long)local_79c * (long)local_7a0 * local_7b8;
        local_a30 = &local_10b0;
        local_908 = &local_10b0;
        local_102c = 1;
        local_1058 = (int *)0x0;
        local_474 = 0x10;
        local_4f4 = 0x10;
        local_a90 = local_bf0;
        local_a94 = local_1018;
        local_a95 = 1;
        local_b50 = local_be0;
        local_b54 = local_1018;
        local_b55 = 1;
        local_10b0 = 0;
        local_10a0 = 0;
        local_1098 = 0;
        local_1088 = 0;
        local_1084 = 0;
        local_1080 = 0;
        local_107c = 0;
        local_1078 = 0;
        local_1070 = 0;
        local_10a8 = 0;
        local_7b0 = local_1068;
        local_380 = local_908;
        local_1090 = local_7c8;
        local_1060 = local_5f0;
        local_1050 = local_5f8;
        local_1048 = local_5fc;
        local_1040 = local_608;
        local_1034 = local_5dc;
        local_1030 = local_5e0;
        local_1028 = local_5e4;
        for (local_10b4 = 0; local_10b4 < local_1014; local_10b4 = local_10b4 + 1) {
          local_b60 = &local_1108;
          local_5a4 = local_be8->w;
          local_5a8 = local_be8->h;
          local_5ac = local_be8->d;
          local_10c0 = (float *)((long)local_be8->data +
                                local_be8->cstep * (long)local_10b4 * local_be8->elemsize);
          local_5c0 = local_be8->elemsize;
          local_5c4 = local_be8->elempack;
          local_5d0 = local_be8->allocator;
          local_5a0 = &local_1108;
          local_500 = (long)local_5a4 * (long)local_5a8 * local_5c0;
          local_8a0 = &local_1108;
          local_8f8 = &local_1108;
          local_504 = 0x10;
          local_b68 = local_be8;
          local_b6c = local_10b4;
          local_b6d = 1;
          local_1108 = 0;
          local_10f8 = 0;
          local_10f0 = 0;
          local_10e0 = 0;
          local_10dc = 0;
          local_10d8 = 0;
          local_10d4 = 0;
          local_10d0 = 0;
          local_10c8 = 0;
          local_1100 = 0;
          local_5b8 = local_10c0;
          local_3a0 = local_8f8;
          local_10e8 = local_5d0;
          for (local_110c = 0; local_110c < local_1010; local_110c = local_110c + 1) {
            for (local_1110 = 0; local_1110 < local_100c; local_1110 = local_1110 + 1) {
              local_1114 = *local_10c0;
              local_1118 = local_10c0[1];
              local_111c = local_10c0[2];
              local_1114 = grid_sample_unormalize(local_bf4,local_1114,*(int *)(in_RDI + 0xd8));
              local_1118 = grid_sample_unormalize(local_bf8,local_1118,*(int *)(in_RDI + 0xd8));
              local_111c = grid_sample_unormalize(local_bfc,local_111c,*(int *)(in_RDI + 0xd8));
              dVar5 = std::floor((double)(ulong)(uint)local_1114);
              local_1124 = (int)SUB84(dVar5,0);
              dVar5 = std::floor((double)(ulong)(uint)local_1118);
              local_1128 = (int)SUB84(dVar5,0);
              dVar5 = std::floor((double)(ulong)(uint)local_111c);
              local_112c = (int)SUB84(dVar5,0);
              local_1130 = local_1124 + 1;
              local_1134 = local_1128 + 1;
              local_1138 = local_112c + 1;
              local_113c = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea24,
                                                             in_stack_ffffffffffffea20),
                                             (int)((ulong)in_stack_ffffffffffffea18 >> 0x20),
                                             (int)in_stack_ffffffffffffea18,
                                             in_stack_ffffffffffffea14,in_stack_ffffffffffffea10,
                                             (int)((ulong)uVar6 >> 0x20));
              local_1140 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea24,
                                                             in_stack_ffffffffffffea20),
                                             (int)((ulong)in_stack_ffffffffffffea18 >> 0x20),
                                             (int)in_stack_ffffffffffffea18,
                                             in_stack_ffffffffffffea14,in_stack_ffffffffffffea10,
                                             (int)((ulong)uVar6 >> 0x20));
              local_1144 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea24,
                                                             in_stack_ffffffffffffea20),
                                             (int)((ulong)in_stack_ffffffffffffea18 >> 0x20),
                                             (int)in_stack_ffffffffffffea18,
                                             in_stack_ffffffffffffea14,in_stack_ffffffffffffea10,
                                             (int)((ulong)uVar6 >> 0x20));
              local_1148 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea24,
                                                             in_stack_ffffffffffffea20),
                                             (int)((ulong)in_stack_ffffffffffffea18 >> 0x20),
                                             (int)in_stack_ffffffffffffea18,
                                             in_stack_ffffffffffffea14,in_stack_ffffffffffffea10,
                                             (int)((ulong)uVar6 >> 0x20));
              local_114c = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea24,
                                                             in_stack_ffffffffffffea20),
                                             (int)((ulong)in_stack_ffffffffffffea18 >> 0x20),
                                             (int)in_stack_ffffffffffffea18,
                                             in_stack_ffffffffffffea14,in_stack_ffffffffffffea10,
                                             (int)((ulong)uVar6 >> 0x20));
              local_1150 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea24,
                                                             in_stack_ffffffffffffea20),
                                             (int)((ulong)in_stack_ffffffffffffea18 >> 0x20),
                                             (int)in_stack_ffffffffffffea18,
                                             in_stack_ffffffffffffea14,in_stack_ffffffffffffea10,
                                             (int)((ulong)uVar6 >> 0x20));
              local_1154 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea24,
                                                             in_stack_ffffffffffffea20),
                                             (int)((ulong)in_stack_ffffffffffffea18 >> 0x20),
                                             (int)in_stack_ffffffffffffea18,
                                             in_stack_ffffffffffffea14,in_stack_ffffffffffffea10,
                                             (int)((ulong)uVar6 >> 0x20));
              local_1158 = get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea24,
                                                             in_stack_ffffffffffffea20),
                                             (int)((ulong)in_stack_ffffffffffffea18 >> 0x20),
                                             (int)in_stack_ffffffffffffea18,
                                             in_stack_ffffffffffffea14,in_stack_ffffffffffffea10,
                                             (int)((ulong)uVar6 >> 0x20));
              local_115c = local_1114 - (float)local_1124;
              local_1160 = local_1118 - (float)local_1128;
              local_1164 = local_111c - (float)local_112c;
              local_1168 = local_113c * (1.0 - local_115c) + local_1140 * local_115c;
              local_116c = local_1144 * (1.0 - local_115c) + local_1148 * local_115c;
              local_1170 = local_114c * (1.0 - local_115c) + local_1150 * local_115c;
              local_1174 = local_1154 * (1.0 - local_115c) + local_1158 * local_115c;
              local_1178 = local_1168 * (1.0 - local_1160) + local_116c * local_1160;
              local_117c = local_1170 * (1.0 - local_1160) + local_1174 * local_1160;
              local_1120 = local_1178 * (1.0 - local_1164) + local_117c * local_1164;
              *local_1068 = local_1120;
              local_1068 = local_1068 + 1;
              local_10c0 = local_10c0 + 3;
            }
          }
        }
        local_8e8 = &local_1060;
        local_3c0 = local_8e8;
        if (local_1058 != (int *)0x0) {
          local_3c4 = 0xffffffff;
          LOCK();
          local_3c8 = *local_1058;
          *local_1058 = *local_1058 + -1;
          UNLOCK();
          if (local_3c8 == 1) {
            if (local_1040 == (Allocator *)0x0) {
              local_40 = local_1060;
              if (local_1060 != (void *)0x0) {
                free(local_1060);
              }
            }
            else {
              (*local_1040->_vptr_Allocator[3])(local_1040,local_1060);
            }
          }
        }
      }
    }
    else if (*(int *)(in_RDI + 0xd0) == 2) {
      for (local_1180 = 0; local_1180 < local_c00; local_1180 = local_1180 + 1) {
        local_b78 = &local_11c8;
        local_56c = local_be0->w;
        local_570 = local_be0->h;
        local_574 = local_be0->d;
        local_580 = (void *)((long)local_be0->data +
                            local_be0->cstep * (long)local_1180 * local_be0->elemsize);
        local_588 = local_be0->elemsize;
        local_58c = local_be0->elempack;
        local_598 = local_be0->allocator;
        local_568 = &local_11c8;
        local_510 = (long)local_56c * (long)local_570 * local_588;
        local_1188 = (local_510 + 0xfU & 0xfffffffffffffff0) / local_588;
        local_11a0 = local_be0->dims + -1;
        if (local_be0->dims == 4) {
          local_1188 = (long)local_be0->w * (long)local_be0->h;
        }
        local_aa0 = &local_1218;
        local_764 = local_bf0->w;
        local_768 = local_bf0->h;
        local_76c = local_bf0->d;
        local_11d0 = (float *)((long)local_bf0->data +
                              local_bf0->cstep * (long)local_1180 * local_bf0->elemsize);
        local_780 = local_bf0->elemsize;
        local_784 = local_bf0->elempack;
        local_790 = local_bf0->allocator;
        local_760 = &local_1218;
        local_480 = (long)local_764 * (long)local_768 * local_780;
        local_a38 = &local_1218;
        local_8d8 = &local_1218;
        local_1194 = 1;
        local_11c0 = (int *)0x0;
        local_484 = 0x10;
        local_514 = 0x10;
        local_aa8 = local_bf0;
        local_aac = local_1180;
        local_aad = 1;
        local_b80 = local_be0;
        local_b84 = local_1180;
        local_b85 = 1;
        local_1218 = 0;
        local_1208 = 0;
        local_1200 = 0;
        local_11f0 = 0;
        local_11ec = 0;
        local_11e8 = 0;
        local_11e4 = 0;
        local_11e0 = 0;
        local_11d8 = 0;
        local_1210 = 0;
        local_778 = local_11d0;
        local_3e0 = local_8d8;
        local_11f8 = local_790;
        local_11c8 = local_580;
        local_11b8 = local_588;
        local_11b0 = local_58c;
        local_11a8 = local_598;
        local_119c = local_56c;
        local_1198 = local_570;
        local_1190 = local_574;
        for (local_121c = 0; local_121c < local_1014; local_121c = local_121c + 1) {
          local_b90 = &local_1270;
          local_534 = local_be8->w;
          local_538 = local_be8->h;
          local_53c = local_be8->d;
          local_1228 = (float *)((long)local_be8->data +
                                local_be8->cstep * (long)local_121c * local_be8->elemsize);
          local_550 = local_be8->elemsize;
          local_554 = local_be8->elempack;
          local_560 = local_be8->allocator;
          local_530 = &local_1270;
          local_520 = (long)local_534 * (long)local_538 * local_550;
          local_8a8 = &local_1270;
          local_8c8 = &local_1270;
          local_524 = 0x10;
          local_b98 = local_be8;
          local_b9c = local_121c;
          local_b9d = 1;
          local_1270 = 0;
          local_1260 = 0;
          local_1258 = 0;
          local_1248 = 0;
          local_1244 = 0;
          local_1240 = 0;
          local_123c = 0;
          local_1238 = 0;
          local_1230 = 0;
          local_1268 = 0;
          local_548 = local_1228;
          local_400 = local_8c8;
          local_1250 = local_560;
          for (local_1274 = 0; local_1274 < local_1010; local_1274 = local_1274 + 1) {
            for (local_1278 = 0; local_1278 < local_100c; local_1278 = local_1278 + 1) {
              fVar3 = local_1228[1];
              fVar4 = local_1228[2];
              fVar2 = grid_sample_unormalize(local_bf4,*local_1228,*(int *)(in_RDI + 0xd8));
              fVar3 = grid_sample_unormalize(local_bf8,fVar3,*(int *)(in_RDI + 0xd8));
              fVar4 = grid_sample_unormalize(local_bfc,fVar4,*(int *)(in_RDI + 0xd8));
              std::round((double)(ulong)(uint)fVar2);
              std::round((double)(ulong)(uint)fVar3);
              std::round((double)(ulong)(uint)fVar4);
              in_stack_ffffffffffffea24 =
                   get_value_bounded((Mat *)CONCAT44(in_stack_ffffffffffffea24,
                                                     in_stack_ffffffffffffea20),
                                     (int)((ulong)in_stack_ffffffffffffea18 >> 0x20),
                                     (int)in_stack_ffffffffffffea18,in_stack_ffffffffffffea14,
                                     in_stack_ffffffffffffea10,(int)((ulong)uVar6 >> 0x20));
              *local_11d0 = in_stack_ffffffffffffea24;
              local_11d0 = local_11d0 + 1;
              local_1228 = local_1228 + 3;
            }
          }
        }
        in_stack_ffffffffffffea18 = &local_11c8;
        local_8b8 = in_stack_ffffffffffffea18;
        local_420 = in_stack_ffffffffffffea18;
        if (local_11c0 != (int *)0x0) {
          local_424 = 0xffffffff;
          LOCK();
          local_428 = *local_11c0;
          *local_11c0 = *local_11c0 + -1;
          UNLOCK();
          if (local_428 == 1) {
            if (local_11a8 == (Allocator *)0x0) {
              local_10 = local_11c8;
              if (local_11c8 != (void *)0x0) {
                free(local_11c8);
              }
            }
            else {
              (*local_11a8->_vptr_Allocator[3])(local_11a8,local_11c8);
            }
          }
        }
        *in_stack_ffffffffffffea18 = (void *)0x0;
        in_stack_ffffffffffffea18[2] = (void *)0x0;
        *(undefined4 *)(in_stack_ffffffffffffea18 + 3) = 0;
        *(undefined4 *)(in_stack_ffffffffffffea18 + 5) = 0;
        *(undefined4 *)((long)in_stack_ffffffffffffea18 + 0x2c) = 0;
        *(undefined4 *)(in_stack_ffffffffffffea18 + 6) = 0;
        *(undefined4 *)((long)in_stack_ffffffffffffea18 + 0x34) = 0;
        *(undefined4 *)(in_stack_ffffffffffffea18 + 7) = 0;
        in_stack_ffffffffffffea18[8] = (void *)0x0;
        in_stack_ffffffffffffea18[1] = (void *)0x0;
      }
    }
    else if (*(int *)(in_RDI + 0xd0) == 3) {
      fprintf(_stderr,"unsupported bicubic when dims == 4");
      fprintf(_stderr,"\n");
      return -1;
    }
  }
  return 0;
}

Assistant:

int GridSample::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 3)
    {
        int outw = grid.h;
        int outh = grid.c;

        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == 1) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        // bilinear interpolate
                        float v;
                        {
                            int x0 = (int)floor(sample_x);
                            int y0 = (int)floor(sample_y);
                            int x1 = x0 + 1;
                            int y1 = y0 + 1;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);

                            float alpha = sample_x - x0;
                            float beta = sample_y - y0;

                            float v0 = v00 * (1 - alpha) + v01 * alpha;
                            float v1 = v10 * (1 - alpha) + v11 * alpha;

                            v = v0 * (1 - beta) + v1 * beta;
                        }

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
        else if (sample_type == 2) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        int x0 = static_cast<int>(round(sample_x));
                        int y0 = static_cast<int>(round(sample_y));

                        float v = get_value_bounded(image, x0, y0, padding_mode, align_corner);

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
        else if (sample_type == 3) // bicubic
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        // bicubic interpolate
                        float v;
                        {
                            int x1 = (int)floorf(sample_x);
                            int y1 = (int)floorf(sample_y);
                            int x0 = x1 - 1;
                            int y0 = y1 - 1;
                            int x2 = x1 + 1;
                            int y2 = y1 + 1;
                            int x3 = x1 + 2;
                            int y3 = y1 + 2;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v02 = get_value_bounded(image, x2, y0, padding_mode, align_corner);
                            float v03 = get_value_bounded(image, x3, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);
                            float v12 = get_value_bounded(image, x2, y1, padding_mode, align_corner);
                            float v13 = get_value_bounded(image, x3, y1, padding_mode, align_corner);
                            float v20 = get_value_bounded(image, x0, y2, padding_mode, align_corner);
                            float v21 = get_value_bounded(image, x1, y2, padding_mode, align_corner);
                            float v22 = get_value_bounded(image, x2, y2, padding_mode, align_corner);
                            float v23 = get_value_bounded(image, x3, y2, padding_mode, align_corner);
                            float v30 = get_value_bounded(image, x0, y3, padding_mode, align_corner);
                            float v31 = get_value_bounded(image, x1, y3, padding_mode, align_corner);
                            float v32 = get_value_bounded(image, x2, y3, padding_mode, align_corner);
                            float v33 = get_value_bounded(image, x3, y3, padding_mode, align_corner);

                            float x_coeffs[4];
                            float y_coeffs[4];
                            interpolate_cubic(sample_x - x1, x_coeffs);
                            interpolate_cubic(sample_y - y1, y_coeffs);

                            float v0 = v00 * x_coeffs[0] + v01 * x_coeffs[1] + v02 * x_coeffs[2] + v03 * x_coeffs[3];
                            float v1 = v10 * x_coeffs[0] + v11 * x_coeffs[1] + v12 * x_coeffs[2] + v13 * x_coeffs[3];
                            float v2 = v20 * x_coeffs[0] + v21 * x_coeffs[1] + v22 * x_coeffs[2] + v23 * x_coeffs[3];
                            float v3 = v30 * x_coeffs[0] + v31 * x_coeffs[1] + v32 * x_coeffs[2] + v33 * x_coeffs[3];

                            v = v0 * y_coeffs[0] + v1 * y_coeffs[1] + v2 * y_coeffs[2] + v3 * y_coeffs[3];
                        }

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
    }

    if (dims == 4)
    {
        int outw = grid.h;
        int outh = grid.d;
        int outd = grid.c;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == 1) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    const float* gridptr = grid.channel(z);

                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = gridptr[0];
                            float sample_y = gridptr[1];
                            float sample_z = gridptr[2];

                            sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                            sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                            sample_z = grid_sample_unormalize(d, sample_z, align_corner);

                            // bilinear interpolate
                            float v;
                            {
                                int x0 = (int)floor(sample_x);
                                int y0 = (int)floor(sample_y);
                                int z0 = (int)floor(sample_z);
                                int x1 = x0 + 1;
                                int y1 = y0 + 1;
                                int z1 = z0 + 1;

                                float v000 = get_value_bounded(image, x0, y0, z0, padding_mode, align_corner);
                                float v001 = get_value_bounded(image, x1, y0, z0, padding_mode, align_corner);
                                float v010 = get_value_bounded(image, x0, y1, z0, padding_mode, align_corner);
                                float v011 = get_value_bounded(image, x1, y1, z0, padding_mode, align_corner);
                                float v100 = get_value_bounded(image, x0, y0, z1, padding_mode, align_corner);
                                float v101 = get_value_bounded(image, x1, y0, z1, padding_mode, align_corner);
                                float v110 = get_value_bounded(image, x0, y1, z1, padding_mode, align_corner);
                                float v111 = get_value_bounded(image, x1, y1, z1, padding_mode, align_corner);

                                float alpha = sample_x - x0;
                                float beta = sample_y - y0;
                                float gamma = sample_z - z0;

                                float v00 = v000 * (1 - alpha) + v001 * alpha;
                                float v01 = v010 * (1 - alpha) + v011 * alpha;
                                float v10 = v100 * (1 - alpha) + v101 * alpha;
                                float v11 = v110 * (1 - alpha) + v111 * alpha;

                                float v0 = v00 * (1 - beta) + v01 * beta;
                                float v1 = v10 * (1 - beta) + v11 * beta;

                                v = v0 * (1 - gamma) + v1 * gamma;
                            }

                            outptr[0] = v;
                            outptr += 1;

                            gridptr += 3;
                        }
                    }
                }
            }
        }
        else if (sample_type == 2) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    const float* gridptr = grid.channel(z);

                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = gridptr[0];
                            float sample_y = gridptr[1];
                            float sample_z = gridptr[2];

                            sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                            sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                            sample_z = grid_sample_unormalize(d, sample_z, align_corner);

                            int x0 = static_cast<int>(round(sample_x));
                            int y0 = static_cast<int>(round(sample_y));
                            int z0 = static_cast<int>(round(sample_z));

                            float v = get_value_bounded(image, x0, y0, z0, padding_mode, align_corner);

                            outptr[0] = v;
                            outptr += 1;

                            gridptr += 3;
                        }
                    }
                }
            }
        }
        else if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -1;
        }
    }

    return 0;
}